

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_property(nk_command_buffer *out,nk_style_property *style,nk_rect *bounds,nk_rect *label
                     ,nk_flags state,char *name,int len,nk_user_font *font)

{
  nk_rect r;
  nk_rect rect;
  nk_rect rect_00;
  undefined8 in_RCX;
  nk_text *in_RDX;
  int *in_RSI;
  char *in_RDI;
  uint in_R8D;
  undefined8 in_R9;
  nk_color c;
  nk_command_buffer *unaff_retaddr;
  nk_rect in_stack_00000008;
  nk_style_item *background;
  nk_text text;
  int *local_48;
  nk_image *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar1;
  int iVar2;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar3;
  float a;
  int len_00;
  
  c = SUB84((ulong)in_R9 >> 0x20,0);
  uVar3 = (undefined4)in_RCX;
  a = (float)((ulong)in_RCX >> 0x20);
  if ((in_R8D & 0x20) == 0) {
    if ((in_R8D & 0x10) == 0) {
      iVar2 = in_RSI[0x19];
      local_48 = in_RSI;
    }
    else {
      local_48 = in_RSI + 8;
      iVar2 = in_RSI[0x1a];
    }
  }
  else {
    local_48 = in_RSI + 0x10;
    iVar2 = in_RSI[0x1b];
  }
  if (*local_48 == 1) {
    r.y = (float)in_R8D;
    r.x = (float)in_stack_ffffffffffffffd8;
    r.w = (float)uVar3;
    r.h = a;
    nk_draw_image((nk_command_buffer *)CONCAT44(iVar2,in_stack_ffffffffffffffc8),r,
                  in_stack_ffffffffffffffc0,c);
    len_00 = (int)((ulong)in_RSI >> 0x20);
    nk_rgba(0,0,0,0);
  }
  else {
    iVar1 = local_48[2];
    rect.y = (float)in_R8D;
    rect.x = (float)in_stack_ffffffffffffffd8;
    rect.w = (float)uVar3;
    rect.h = a;
    nk_fill_rect((nk_command_buffer *)CONCAT44(iVar2,iVar1),rect,
                 (float)((ulong)in_stack_ffffffffffffffc0 >> 0x20),c);
    len_00 = (int)((ulong)in_RSI >> 0x20);
    rect_00.y = (float)in_R8D;
    rect_00.x = (float)in_stack_ffffffffffffffd8;
    rect_00.w = (float)uVar3;
    rect_00.h = a;
    nk_stroke_rect((nk_command_buffer *)CONCAT44(iVar2,iVar1),rect_00,
                   (float)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                   SUB84(in_stack_ffffffffffffffc0,0),c);
  }
  nk_vec2(0.0,0.0);
  nk_widget_text(unaff_retaddr,in_stack_00000008,in_RDI,len_00,in_RDX,(nk_flags)a,
                 (nk_user_font *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8));
  return;
}

Assistant:

NK_LIB void
nk_draw_property(struct nk_command_buffer *out, const struct nk_style_property *style,
const struct nk_rect *bounds, const struct nk_rect *label, nk_flags state,
const char *name, int len, const struct nk_user_font *font)
{
struct nk_text text;
const struct nk_style_item *background;

/* select correct background and text color */
if (state & NK_WIDGET_STATE_ACTIVED) {
background = &style->active;
text.text = style->label_active;
} else if (state & NK_WIDGET_STATE_HOVER) {
background = &style->hover;
text.text = style->label_hover;
} else {
background = &style->normal;
text.text = style->label_normal;
}

/* draw background */
if (background->type == NK_STYLE_ITEM_IMAGE) {
nk_draw_image(out, *bounds, &background->data.image, nk_white);
text.background = nk_rgba(0,0,0,0);
} else {
text.background = background->data.color;
nk_fill_rect(out, *bounds, style->rounding, background->data.color);
nk_stroke_rect(out, *bounds, style->rounding, style->border, background->data.color);
}

/* draw label */
text.padding = nk_vec2(0,0);
nk_widget_text(out, *label, name, len, &text, NK_TEXT_CENTERED, font);
}